

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_parse_sample_line(bcf_hdr_t *h,char *str)

{
  int iVar1;
  char *__dest;
  char *s;
  char *q;
  char *p;
  int i;
  int ret;
  char *str_local;
  bcf_hdr_t *h_local;
  
  p._4_4_ = 0;
  p._0_4_ = 0;
  s = str;
  q = str;
  do {
    if (((*s == '\t') || (*s == '\0')) || (*s == '\n')) {
      p._0_4_ = (int)p + 1;
      if (9 < (int)p) {
        __dest = (char *)malloc((size_t)(s + (1 - (long)q)));
        strncpy(__dest,q,(long)s - (long)q);
        __dest[(long)s - (long)q] = '\0';
        iVar1 = bcf_hdr_add_sample(h,__dest);
        if (iVar1 < 0) {
          p._4_4_ = -1;
        }
        free(__dest);
      }
      if ((*s == '\0') || (*s == '\n')) {
        bcf_hdr_add_sample(h,(char *)0x0);
        return p._4_4_;
      }
      q = s + 1;
    }
    s = s + 1;
  } while( true );
}

Assistant:

int bcf_hdr_parse_sample_line(bcf_hdr_t *h, const char *str)
{
    int ret = 0;
    int i = 0;
    const char *p, *q;
    // add samples
    for (p = q = str;; ++q) {
        if (*q != '\t' && *q != 0 && *q != '\n') continue;
        if (++i > 9) {
            char *s = (char*)malloc(q - p + 1);
            strncpy(s, p, q - p);
            s[q - p] = 0;
            if ( bcf_hdr_add_sample(h,s) < 0 ) ret = -1;
            free(s);
        }
        if (*q == 0 || *q == '\n') break;
        p = q + 1;
    }
    bcf_hdr_add_sample(h,NULL);
    return ret;
}